

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O1

int router_wrapper(CManager cm,_event_item *event,void *client_data,attr_list attrs,int out_count,
                  int *out_stones)

{
  undefined8 uVar1;
  code *pcVar2;
  uint uVar3;
  int iVar4;
  __pid_t _Var5;
  pthread_t pVar6;
  char *__format;
  FILE *pFVar7;
  ev_state_data ev_state;
  timespec local_78;
  int local_60;
  int *local_58;
  
  if (*(code **)((long)client_data + 0x10) == (code *)0x0) {
    uVar1 = *(undefined8 *)((long)client_data + 0x20);
    pcVar2 = (code *)**(undefined8 **)((long)client_data + 0x18);
    local_78.tv_sec = (__time_t)cm;
    local_78.tv_nsec = (long)event;
    local_60 = out_count;
    local_58 = out_stones;
    cod_assoc_client_data(uVar1,0x34567890);
    uVar3 = (*pcVar2)(uVar1,event->decoded_event,attrs);
  }
  else {
    uVar3 = (**(code **)((long)client_data + 0x10))(event->decoded_event,attrs);
  }
  if ((int)uVar3 < 0) {
    iVar4 = CMtrace_val[10];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(cm,EVerbose);
    }
    if (iVar4 == 0) goto LAB_00137e57;
    if (CMtrace_PID != 0) {
      pFVar7 = (FILE *)cm->CMTrace_file;
      _Var5 = getpid();
      pVar6 = pthread_self();
      fprintf(pFVar7,"P%lxT%lx - ",(long)_Var5,pVar6);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_78);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_78.tv_sec,local_78.tv_nsec);
    }
    pFVar7 = (FILE *)cm->CMTrace_file;
    __format = "Router function returned %d, NOT submitting\n";
  }
  else if ((int)uVar3 < out_count) {
    if (out_stones[uVar3] != -1) {
      iVar4 = CMtrace_val[10];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar4 = CMtrace_init(cm,EVerbose);
      }
      if (iVar4 != 0) {
        if (CMtrace_PID != 0) {
          pFVar7 = (FILE *)cm->CMTrace_file;
          _Var5 = getpid();
          pVar6 = pthread_self();
          fprintf(pFVar7,"P%lxT%lx - ",(long)_Var5,pVar6);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_78);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_78.tv_sec,local_78.tv_nsec);
        }
        fprintf((FILE *)cm->CMTrace_file,
                "Router function returned %d, submitting further to stone %d\n",(ulong)uVar3,
                (ulong)(uint)out_stones[uVar3]);
      }
      fflush((FILE *)cm->CMTrace_file);
      internal_path_submit(cm,out_stones[uVar3],event);
      return uVar3;
    }
    iVar4 = CMtrace_val[10];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(cm,EVerbose);
    }
    if (iVar4 == 0) goto LAB_00137e57;
    if (CMtrace_PID != 0) {
      pFVar7 = (FILE *)cm->CMTrace_file;
      _Var5 = getpid();
      pVar6 = pthread_self();
      fprintf(pFVar7,"P%lxT%lx - ",(long)_Var5,pVar6);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_78);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_78.tv_sec,local_78.tv_nsec);
    }
    pFVar7 = (FILE *)cm->CMTrace_file;
    __format = "Router function returned %d, which has not been set with EVaction_set_output()\n";
  }
  else {
    iVar4 = CMtrace_val[10];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(cm,EVerbose);
    }
    if (iVar4 == 0) goto LAB_00137e57;
    if (CMtrace_PID != 0) {
      pFVar7 = (FILE *)cm->CMTrace_file;
      _Var5 = getpid();
      pVar6 = pthread_self();
      fprintf(pFVar7,"P%lxT%lx - ",(long)_Var5,pVar6);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_78);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_78.tv_sec,local_78.tv_nsec);
    }
    pFVar7 = (FILE *)cm->CMTrace_file;
    __format = "Router function returned %d, larger than the number of associated outputs\n";
  }
  fprintf(pFVar7,__format,(ulong)uVar3);
LAB_00137e57:
  fflush((FILE *)cm->CMTrace_file);
  return uVar3;
}

Assistant:

static int
router_wrapper(CManager cm, struct _event_item *event, void *client_data,
	       attr_list attrs, int out_count, int *out_stones)
{
    response_instance instance = (response_instance)client_data;
    int ret;
    if (instance->u.filter.func_ptr) {
	ret = ((int(*)(void *, attr_list))instance->u.filter.func_ptr)(event->decoded_event, attrs);
    } else {
#ifdef HAVE_COD_H
	int (*func)(cod_exec_context, void *, attr_list) =
	    (int(*)(cod_exec_context, void *, attr_list))instance->u.filter.code->func;
	cod_exec_context ec = instance->u.filter.ec;
	struct ev_state_data ev_state;

	ev_state.cm = cm;
	ev_state.cur_event = event;
	ev_state.out_count = out_count;
	ev_state.out_stones = out_stones;
	cod_assoc_client_data(ec, 0x34567890, (intptr_t)&ev_state);
	ret = (func)(ec, event->decoded_event, attrs);
#endif
    }
    if (ret >= 0) {
	if (ret >= out_count) {
	    CMtrace_out(cm, EVerbose, "Router function returned %d, larger than the number of associated outputs\n", ret);
	} else if (out_stones[ret] == -1) {
	    CMtrace_out(cm, EVerbose, "Router function returned %d, which has not been set with EVaction_set_output()\n", ret);
	} else {
	    CMtrace_out(cm, EVerbose, "Router function returned %d, submitting further to stone %d\n", ret, out_stones[ret]);
	    internal_path_submit(cm, out_stones[ret], event);
	}
    } else {
	CMtrace_out(cm, EVerbose, "Router function returned %d, NOT submitting\n", ret);
    }
    return ret;
}